

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

runtime_type<> * __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
reentrant_put_transaction<void>::complete_type(reentrant_put_transaction<void> *this)

{
  uintptr_t uint_pointer;
  
  if (this->m_queue ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x6f8);
  }
  return (runtime_type<> *)((this->m_put_data).m_control_block + 1);
}

Assistant:

const RUNTIME_TYPE & complete_type() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return *type_after_control(m_put_data.m_control_block);
            }